

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall gl4cts::anon_unknown_0::BasicAPIGet::~BasicAPIGet(BasicAPIGet *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual long Run()
	{
		if (!CheckMax(GL_MAX_IMAGE_UNITS, 8))
		{
			Output("GL_MAX_IMAGE_UNITS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, 8))
		{
			Output("GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_IMAGE_SAMPLES, 0))
		{
			Output("GL_MAX_IMAGE_SAMPLES value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_VERTEX_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_VERTEX_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_GEOMETRY_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_GEOMETRY_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, 8))
		{
			Output("GL_MAX_FRAGMENT_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMBINED_IMAGE_UNIFORMS, 8))
		{
			Output("GL_MAX_COMBINED_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		return NO_ERROR;
	}